

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O1

void __thiscall EmmyFacade::Destroy(EmmyFacade *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  OnDisconnect(this);
  peVar1 = (this->transporter).super___shared_ptr<Transporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*peVar1->_vptr_Transporter[2])();
    this_00 = (this->transporter).super___shared_ptr<Transporter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->transporter).super___shared_ptr<Transporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->transporter).super___shared_ptr<Transporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      return;
    }
  }
  return;
}

Assistant:

void EmmyFacade::Destroy() {
	OnDisconnect();

	if (transporter) {
		transporter->Stop();
		transporter = nullptr;
	}
}